

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 2d.cpp
# Opt level: O2

bool Read2D(MemFile *file,shared_ptr<Disk> *disk)

{
  Disk *this;
  bool bVar1;
  int iVar2;
  int iVar3;
  string *path;
  Data *data;
  FILE *__stream;
  allocator<char> local_89;
  undefined1 local_88 [36];
  Format fmt;
  
  Format::Format(&fmt,_2D);
  path = MemFile::name_abi_cxx11_(file);
  __stream = (FILE *)local_88;
  std::__cxx11::string::string<std::allocator<char>>((string *)__stream,"2d",&local_89);
  bVar1 = IsFileExt(path,(string *)__stream);
  if (bVar1) {
    iVar2 = MemFile::size(file);
    iVar3 = Format::disk_size(&fmt);
    std::__cxx11::string::~string((string *)local_88);
    if (iVar2 == iVar3) {
      MemFile::rewind(file,__stream);
      this = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      data = MemFile::data(file);
      Disk::format(this,&fmt,data,false);
      std::__cxx11::string::assign
                ((char *)&((disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                          strType);
      return true;
    }
  }
  else {
    std::__cxx11::string::~string((string *)local_88);
  }
  return false;
}

Assistant:

bool Read2D(MemFile& file, std::shared_ptr<Disk>& disk)
{
    Format fmt{ RegularFormat::_2D };

    if (!IsFileExt(file.name(), "2d") || file.size() != fmt.disk_size())
        return false;

    file.rewind();
    disk->format(fmt, file.data());
    disk->strType = "2D";

    return true;
}